

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_sizeof_uint(uint64_t num)

{
  uint64_t num_local;
  
  if (num < 0x80) {
    num_local._4_4_ = 1;
  }
  else if (num < 0x100) {
    num_local._4_4_ = 2;
  }
  else if (num < 0x10000) {
    num_local._4_4_ = 3;
  }
  else if (num < 0x100000000) {
    num_local._4_4_ = 5;
  }
  else {
    num_local._4_4_ = 9;
  }
  return num_local._4_4_;
}

Assistant:

MP_IMPL uint32_t
mp_sizeof_uint(uint64_t num)
{
	if (num <= 0x7f) {
		return 1;
	} else if (num <= UINT8_MAX) {
		return 1 + sizeof(uint8_t);
	} else if (num <= UINT16_MAX) {
		return 1 + sizeof(uint16_t);
	} else if (num <= UINT32_MAX) {
		return 1 + sizeof(uint32_t);
	} else {
		return 1 + sizeof(uint64_t);
	}
}